

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

NULLCRef * NULLCTypeInfo::GetFunctionContext(NULLCRef obj)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  char *pcVar3;
  anon_union_4_2_4d8b2ff0_for_ExternTypeInfo_14 aVar4;
  anon_union_4_2_4d8b2ff0_for_ExternTypeInfo_14 *in_RDI;
  uint in_stack_00000008;
  undefined8 *in_stack_0000000c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x15d,"NULLCRef NULLCTypeInfo::GetFunctionContext(NULLCRef)");
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if (pEVar1->subCat == CAT_FUNCTION) {
    pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                        *(uint *)(in_stack_0000000c + 1));
    *(undefined8 *)(in_RDI + 1) = *in_stack_0000000c;
    in_RDI->subType = 0;
    if (pEVar2->contextType == 0xffffffff) {
      return (NULLCRef *)in_RDI;
    }
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        pEVar2->contextType);
    aVar4 = pEVar1->field_11;
  }
  else {
    pcVar3 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
    aVar4.subType = 0;
    nullcThrowError("functionGetContext: received type \'%s\' that is not a function",pcVar3);
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  *in_RDI = aVar4;
  return (NULLCRef *)in_RDI;
}

Assistant:

NULLCRef GetFunctionContext(NULLCRef obj)
	{
		assert(linker);
		NULLCRef ret;

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionGetContext: received type '%s' that is not a function", &linker->exSymbols[type.offsetToName]);
			ret.ptr = NULL;
			ret.typeID = 0;
			return ret;
		}

		NULLCFuncPtr *ptr = (NULLCFuncPtr*)obj.ptr;

		ExternFuncInfo &function = linker->exFunctions[ptr->id];
		ret.ptr = (char*)ptr->context;
		ret.typeID = 0;

		if(function.contextType != ~0u)
		{
			ExternTypeInfo &contextType = linker->exTypes[function.contextType];
			ret.typeID = contextType.subType;
		}

		return ret;
	}